

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O1

JSONValue * JSONValue::Parse(wchar_t **data)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  JSONValue *this;
  bool bVar5;
  int iVar6;
  JSONValue *pJVar7;
  long lVar8;
  JSONValue *pJVar9;
  iterator iVar10;
  mapped_type *ppJVar11;
  undefined8 uVar12;
  _Self __tmp;
  undefined1 auVar13 [8];
  _Self __tmp_1;
  double dVar14;
  ulong extraout_XMM0_Qb;
  double dVar15;
  wstring str;
  wstring name;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_88;
  _Rb_tree_node_base *local_78;
  size_t local_70;
  wstring *local_68;
  ulong uStack_60;
  wstring local_50;
  
  pwVar4 = *data;
  if (*pwVar4 == L'\"') {
    uStack_90 = (JSONValue **)0x0;
    local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffff00000000;
    *data = pwVar4 + 1;
    local_98 = (undefined1  [8])&local_88;
    bVar5 = JSON::ExtractString(data,(wstring *)local_98);
    if (bVar5) {
      pJVar7 = (JSONValue *)operator_new(0x10);
      JSONValue(pJVar7,(wstring *)local_98);
    }
    else {
      pJVar7 = (JSONValue *)0x0;
    }
    if (local_98 == (undefined1  [8])&local_88) {
      return pJVar7;
    }
LAB_0017258e:
    operator_delete((void *)local_98);
    return pJVar7;
  }
  lVar8 = 0;
  do {
    if (lVar8 == 4) {
      iVar6 = wcsncasecmp(pwVar4,L"true",4);
      if (iVar6 == 0) goto LAB_001725c9;
      break;
    }
    pwVar1 = pwVar4 + lVar8;
    lVar8 = lVar8 + 1;
  } while (*pwVar1 != L'\0');
  pwVar4 = *data;
  if (pwVar4 != (wchar_t *)0x0) {
    lVar8 = 0;
    do {
      if (lVar8 == 5) {
        iVar6 = wcsncasecmp(pwVar4,L"false",5);
        if (iVar6 == 0) {
LAB_001725c9:
          iVar6 = wcsncasecmp(*data,L"true",4);
          *data = (wchar_t *)((long)*data + (ulong)((iVar6 == 0 ^ 5) << 2));
          pJVar7 = (JSONValue *)operator_new(0x10);
          pJVar7->type = JSONType_Bool;
          (pJVar7->field_1).bool_value = iVar6 == 0;
          return pJVar7;
        }
        break;
      }
      pwVar1 = pwVar4 + lVar8;
      lVar8 = lVar8 + 1;
    } while (*pwVar1 != L'\0');
  }
  pwVar4 = *data;
  if (pwVar4 != (wchar_t *)0x0) {
    lVar8 = 0;
    do {
      if (lVar8 == 4) {
        iVar6 = wcsncasecmp(pwVar4,L"null",4);
        if (iVar6 == 0) {
          *data = *data + 4;
          pJVar7 = (JSONValue *)operator_new(0x10);
          pJVar7->type = JSONType_Null;
          return pJVar7;
        }
        break;
      }
      pwVar1 = pwVar4 + lVar8;
      lVar8 = lVar8 + 1;
    } while (*pwVar1 != L'\0');
  }
  pwVar4 = *data;
  wVar2 = *pwVar4;
  pJVar7 = (JSONValue *)(ulong)(uint)wVar2;
  if (wVar2 == L'-') {
    *data = pwVar4 + 1;
LAB_00172648:
    wVar3 = **data;
    if (wVar3 == L'0') {
      *data = *data + 1;
      local_68 = (wstring *)0x0;
      uStack_60 = 0;
    }
    else {
      if (8 < (uint)(wVar3 + L'\xffffffcf')) goto LAB_00172c5b;
      local_68 = (wstring *)JSON::ParseInt(data);
      uStack_60 = extraout_XMM0_Qb;
    }
    pwVar4 = *data;
    if (*pwVar4 == L'.') {
      *data = pwVar4 + 1;
      if (9 < (uint)(pwVar4[1] + L'\xffffffd0')) goto LAB_00172c5b;
      dVar14 = JSON::ParseDecimal(data);
      local_68 = (wstring *)((double)local_68 + dVar14);
    }
    pwVar4 = *data;
    if ((*pwVar4 | 0x20U) == 0x65) {
      *data = pwVar4 + 1;
      wVar3 = pwVar4[1];
      if ((wVar3 == L'-') || (wVar3 == L'+')) {
        bVar5 = wVar3 == L'-';
        *data = pwVar4 + 2;
      }
      else {
        bVar5 = false;
      }
      wVar3 = **data;
      if ((uint)(wVar3 + L'\xffffffd0') < 10) {
        dVar14 = JSON::ParseInt(data);
        dVar15 = 0.0;
        if (0.0 < dVar14) {
          do {
            if (bVar5) {
              local_68 = (wstring *)((double)local_68 / 10.0);
            }
            else {
              local_68 = (wstring *)((double)local_68 * 10.0);
            }
            dVar15 = dVar15 + 1.0;
          } while (dVar15 < dVar14);
        }
      }
      if (9 < (uint)(wVar3 + L'\xffffffd0')) goto LAB_00172c5b;
    }
    if (wVar2 == L'-') {
      local_68 = (wstring *)((ulong)local_68 ^ 0x8000000000000000);
      uStack_60 = uStack_60 ^ 0x8000000000000000;
    }
    pJVar7 = (JSONValue *)operator_new(0x10);
    pJVar7->type = JSONType_Number;
    (pJVar7->field_1).string_value = local_68;
  }
  else {
    if ((uint)(wVar2 + L'\xffffffd0') < 10) goto LAB_00172648;
    if (wVar2 == L'[') {
      local_98 = (undefined1  [8])0x0;
      uStack_90 = (JSONValue **)0x0;
      local_88._M_allocated_capacity = 0;
      *data = pwVar4 + 1;
      do {
        if (**data == L'\0') {
          if (local_98 == (undefined1  [8])uStack_90) {
LAB_00172d59:
            pJVar7 = (JSONValue *)0x0;
          }
          else {
            pJVar7 = (JSONValue *)0x0;
            auVar13 = local_98;
            do {
              pJVar9 = *(JSONValue **)auVar13;
              if (pJVar9 != (JSONValue *)0x0) {
                ~JSONValue(pJVar9);
                operator_delete(pJVar9);
              }
              auVar13 = (undefined1  [8])((long)auVar13 + 8);
            } while (auVar13 != (undefined1  [8])uStack_90);
          }
          break;
        }
        bVar5 = JSON::SkipWhitespace(data);
        if (!bVar5) {
          if (local_98 == (undefined1  [8])uStack_90) goto LAB_00172d59;
          pJVar7 = (JSONValue *)0x0;
          auVar13 = local_98;
          do {
            pJVar9 = *(JSONValue **)auVar13;
            if (pJVar9 != (JSONValue *)0x0) {
              ~JSONValue(pJVar9);
              operator_delete(pJVar9);
            }
            auVar13 = (undefined1  [8])((long)auVar13 + 8);
          } while (auVar13 != (undefined1  [8])uStack_90);
          break;
        }
        if (((undefined1  [8])uStack_90 == local_98) && (**data == L']')) {
          *data = *data + 1;
          pJVar7 = (JSONValue *)operator_new(0x10);
          JSONValue(pJVar7,(JSONArray *)local_98);
          break;
        }
        local_50._M_dataplus._M_p = (pointer)Parse(data);
        auVar13 = local_98;
        if ((JSONValue *)local_50._M_dataplus._M_p == (JSONValue *)0x0) {
          for (; auVar13 != (undefined1  [8])uStack_90;
              auVar13 = (undefined1  [8])((long)auVar13 + 8)) {
            pJVar7 = *(JSONValue **)auVar13;
            if (pJVar7 != (JSONValue *)0x0) {
              ~JSONValue(pJVar7);
              operator_delete(pJVar7);
            }
          }
LAB_00172c09:
          bVar5 = false;
          pJVar7 = (JSONValue *)0x0;
        }
        else {
          if (uStack_90 == (JSONValue **)local_88._M_allocated_capacity) {
            std::vector<JSONValue*,std::allocator<JSONValue*>>::_M_realloc_insert<JSONValue*const&>
                      ((vector<JSONValue*,std::allocator<JSONValue*>> *)local_98,uStack_90,
                       (JSONValue **)&local_50);
          }
          else {
            *uStack_90 = (JSONValue *)local_50._M_dataplus._M_p;
            uStack_90 = uStack_90 + 1;
          }
          bVar5 = JSON::SkipWhitespace(data);
          auVar13 = local_98;
          if (!bVar5) {
            for (; auVar13 != (undefined1  [8])uStack_90;
                auVar13 = (undefined1  [8])((long)auVar13 + 8)) {
              pJVar7 = *(JSONValue **)auVar13;
              if (pJVar7 != (JSONValue *)0x0) {
                ~JSONValue(pJVar7);
                operator_delete(pJVar7);
              }
            }
            goto LAB_00172c09;
          }
          pwVar4 = *data;
          if (*pwVar4 == L',') {
            *data = pwVar4 + 1;
            bVar5 = true;
          }
          else {
            if (*pwVar4 != L']') {
              for (; auVar13 != (undefined1  [8])uStack_90;
                  auVar13 = (undefined1  [8])((long)auVar13 + 8)) {
                pJVar7 = *(JSONValue **)auVar13;
                if (pJVar7 != (JSONValue *)0x0) {
                  ~JSONValue(pJVar7);
                  operator_delete(pJVar7);
                }
              }
              goto LAB_00172c09;
            }
            *data = pwVar4 + 1;
            pJVar7 = (JSONValue *)operator_new(0x10);
            JSONValue(pJVar7,(JSONArray *)local_98);
            bVar5 = false;
          }
        }
      } while (bVar5);
      if (local_98 == (undefined1  [8])0x0) {
        return pJVar7;
      }
      goto LAB_0017258e;
    }
    if (wVar2 == L'{') {
      uStack_90 = (JSONValue **)((ulong)uStack_90._4_4_ << 0x20);
      local_88._M_allocated_capacity = 0;
      local_70 = 0;
      *data = pwVar4 + 1;
      local_88._8_8_ = (_Rb_tree_node_base *)&uStack_90;
      local_78 = (_Rb_tree_node_base *)&uStack_90;
      do {
        if (**data == L'\0') {
          if ((_Rb_tree_node_base *)local_88._8_8_ == (_Rb_tree_node_base *)&uStack_90) {
LAB_00172d54:
            pJVar7 = (JSONValue *)0x0;
          }
          else {
            pJVar7 = (JSONValue *)0x0;
            uVar12 = local_88._8_8_;
            do {
              pJVar9 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar9 != (JSONValue *)0x0) {
                ~JSONValue(pJVar9);
                operator_delete(pJVar9);
              }
              uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
            } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90);
          }
          break;
        }
        bVar5 = JSON::SkipWhitespace(data);
        if (!bVar5) {
          if ((_Rb_tree_node_base *)local_88._8_8_ != (_Rb_tree_node_base *)&uStack_90) {
            pJVar7 = (JSONValue *)0x0;
            uVar12 = local_88._8_8_;
            do {
              pJVar9 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar9 != (JSONValue *)0x0) {
                ~JSONValue(pJVar9);
                operator_delete(pJVar9);
              }
              uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
            } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90);
            break;
          }
          goto LAB_00172d54;
        }
        if ((local_70 == 0) && (**data == L'}')) {
          *data = *data + 1;
          pJVar7 = (JSONValue *)operator_new(0x10);
          JSONValue(pJVar7,(JSONObject *)local_98);
          break;
        }
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = L'\0';
        *data = *data + 1;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        bVar5 = JSON::ExtractString(data,&local_50);
        uVar12 = local_88._8_8_;
        if (bVar5) {
          bVar5 = JSON::SkipWhitespace(data);
          uVar12 = local_88._8_8_;
          if (!bVar5) {
            for (; (_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              pJVar7 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar7 != (JSONValue *)0x0) {
                ~JSONValue(pJVar7);
                operator_delete(pJVar7);
              }
            }
            goto LAB_00172943;
          }
          pwVar4 = *data;
          *data = pwVar4 + 1;
          if (*pwVar4 != L':') {
            for (; (_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              pJVar7 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar7 != (JSONValue *)0x0) {
                ~JSONValue(pJVar7);
                operator_delete(pJVar7);
              }
            }
            goto LAB_00172943;
          }
          bVar5 = JSON::SkipWhitespace(data);
          uVar12 = local_88._8_8_;
          if (!bVar5) {
            for (; (_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              pJVar7 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar7 != (JSONValue *)0x0) {
                ~JSONValue(pJVar7);
                operator_delete(pJVar7);
              }
            }
            goto LAB_00172943;
          }
          pJVar9 = Parse(data);
          if (pJVar9 == (JSONValue *)0x0) {
            uVar12 = local_88._8_8_;
            if ((_Rb_tree_node_base *)local_88._8_8_ == (_Rb_tree_node_base *)&uStack_90)
            goto LAB_00172943;
            do {
              pJVar7 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar7 != (JSONValue *)0x0) {
                ~JSONValue(pJVar7);
                operator_delete(pJVar7);
              }
              uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
              bVar5 = false;
              pJVar7 = (JSONValue *)0x0;
            } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90);
          }
          else {
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                             *)local_98,&local_50);
            if (iVar10._M_node != (_Rb_tree_node_base *)&uStack_90) {
              ppJVar11 = std::
                         map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                       *)local_98,&local_50);
              this = *ppJVar11;
              if (this != (JSONValue *)0x0) {
                ~JSONValue(this);
                operator_delete(this);
              }
            }
            ppJVar11 = std::
                       map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                     *)local_98,&local_50);
            *ppJVar11 = pJVar9;
            bVar5 = JSON::SkipWhitespace(data);
            if (bVar5) {
              pwVar4 = *data;
              if (*pwVar4 == L',') {
                *data = pwVar4 + 1;
                bVar5 = true;
              }
              else if (*pwVar4 == L'}') {
                *data = pwVar4 + 1;
                pJVar7 = (JSONValue *)operator_new(0x10);
                JSONValue(pJVar7,(JSONObject *)local_98);
                bVar5 = false;
              }
              else {
                uVar12 = local_88._8_8_;
                if ((_Rb_tree_node_base *)local_88._8_8_ == (_Rb_tree_node_base *)&uStack_90)
                goto LAB_00172943;
                do {
                  pJVar7 = *(JSONValue **)(uVar12 + 0x40);
                  if (pJVar7 != (JSONValue *)0x0) {
                    ~JSONValue(pJVar7);
                    operator_delete(pJVar7);
                  }
                  uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
                  bVar5 = false;
                  pJVar7 = (JSONValue *)0x0;
                } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90);
              }
            }
            else {
              uVar12 = local_88._8_8_;
              if ((_Rb_tree_node_base *)local_88._8_8_ == (_Rb_tree_node_base *)&uStack_90)
              goto LAB_00172943;
              do {
                pJVar7 = *(JSONValue **)(uVar12 + 0x40);
                if (pJVar7 != (JSONValue *)0x0) {
                  ~JSONValue(pJVar7);
                  operator_delete(pJVar7);
                }
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
                bVar5 = false;
                pJVar7 = (JSONValue *)0x0;
              } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90);
            }
          }
        }
        else {
          for (; (_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&uStack_90;
              uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
            pJVar7 = *(JSONValue **)(uVar12 + 0x40);
            if (pJVar7 != (JSONValue *)0x0) {
              ~JSONValue(pJVar7);
              operator_delete(pJVar7);
            }
          }
LAB_00172943:
          bVar5 = false;
          pJVar7 = (JSONValue *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      } while (bVar5);
      std::
      _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                   *)local_98);
      return pJVar7;
    }
LAB_00172c5b:
    pJVar7 = (JSONValue *)0x0;
  }
  return pJVar7;
}

Assistant:

JSONValue *JSONValue::Parse(const wchar_t **data)
{
	// Is it a string?
	if (**data == '"')
	{
		std::wstring str;
		if (!JSON::ExtractString(&(++(*data)), str))
			return NULL;
		else
			return new JSONValue(str);
	}

	// Is it a boolean?
	else if ((simplejson_wcsnlen(*data, 4) && wcsncasecmp(*data, L"true", 4) == 0) || (simplejson_wcsnlen(*data, 5) && wcsncasecmp(*data, L"false", 5) == 0))
	{
		bool value = wcsncasecmp(*data, L"true", 4) == 0;
		(*data) += value ? 4 : 5;
		return new JSONValue(value);
	}

	// Is it a null?
	else if (simplejson_wcsnlen(*data, 4) && wcsncasecmp(*data, L"null", 4) == 0)
	{
		(*data) += 4;
		return new JSONValue();
	}

	// Is it a number?
	else if (**data == L'-' || (**data >= L'0' && **data <= L'9'))
	{
		// Negative?
		bool neg = **data == L'-';
		if (neg) (*data)++;

		double number = 0.0;

		// Parse the whole part of the number - only if it wasn't 0
		if (**data == L'0')
			(*data)++;
		else if (**data >= L'1' && **data <= L'9')
			number = JSON::ParseInt(data);
		else
			return NULL;

		// Could be a decimal now...
		if (**data == '.')
		{
			(*data)++;

			// Not get any digits?
			if (!(**data >= L'0' && **data <= L'9'))
				return NULL;

			// Find the decimal and sort the decimal place out
			// Use ParseDecimal as ParseInt won't work with decimals less than 0.1
			// thanks to Javier Abadia for the report & fix
			double decimal = JSON::ParseDecimal(data);

			// Save the number
			number += decimal;
		}

		// Could be an exponent now...
		if (**data == L'E' || **data == L'e')
		{
			(*data)++;

			// Check signage of expo
			bool neg_expo = false;
			if (**data == L'-' || **data == L'+')
			{
				neg_expo = **data == L'-';
				(*data)++;
			}

			// Not get any digits?
			if (!(**data >= L'0' && **data <= L'9'))
				return NULL;

			// Sort the expo out
			double expo = JSON::ParseInt(data);
			for (double i = 0.0; i < expo; i++)
				number = neg_expo ? (number / 10.0) : (number * 10.0);
		}

		// Was it neg?
		if (neg) number *= -1;

		return new JSONValue(number);
	}

	// An object?
	else if (**data == L'{')
	{
		JSONObject object;

		(*data)++;

		while (**data != 0)
		{
			// Whitespace at the start?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Special case - empty object
			if (object.size() == 0 && **data == L'}')
			{
				(*data)++;
				return new JSONValue(object);
			}

			// We want a string now...
			std::wstring name;
			if (!JSON::ExtractString(&(++(*data)), name))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Need a : now
			if (*((*data)++) != L':')
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// The value is here
			JSONValue *value = Parse(data);
			if (value == NULL)
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Add the name:value
			if (object.find(name) != object.end())
				delete object[name];
			object[name] = value;

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// End of object?
			if (**data == L'}')
			{
				(*data)++;
				return new JSONValue(object);
			}

			// Want a , now
			if (**data != L',')
			{
				FREE_OBJECT(object);
				return NULL;
			}

			(*data)++;
		}

		// Only here if we ran out of data
		FREE_OBJECT(object);
		return NULL;
	}

	// An array?
	else if (**data == L'[')
	{
		JSONArray array;

		(*data)++;

		while (**data != 0)
		{
			// Whitespace at the start?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// Special case - empty array
			if (array.size() == 0 && **data == L']')
			{
				(*data)++;
				return new JSONValue(array);
			}

			// Get the value
			JSONValue *value = Parse(data);
			if (value == NULL)
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// Add the value
			array.push_back(value);

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// End of array?
			if (**data == L']')
			{
				(*data)++;
				return new JSONValue(array);
			}

			// Want a , now
			if (**data != L',')
			{
				FREE_ARRAY(array);
				return NULL;
			}

			(*data)++;
		}

		// Only here if we ran out of data
		FREE_ARRAY(array);
		return NULL;
	}

	// Ran out of possibilites, it's bad!
	else
	{
		return NULL;
	}
}